

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O0

char * itochr(int i)

{
  CharBuff *buff_00;
  char *s;
  char *value;
  int n;
  CharBuff *buff;
  int num;
  int i_local;
  
  buff._0_4_ = i;
  if (i < 1) {
    buff._0_4_ = -i;
  }
  if ((int)buff == 0) {
    _num = "0";
  }
  else {
    buff_00 = new_buff(10);
    for (; 0 < (int)buff; buff._0_4_ = (int)buff / 10) {
      append_chr(buff_00,(char)((int)buff % 10) + '0');
    }
    if (i < 0) {
      append_chr(buff_00,'-');
    }
    s = to_string(buff_00);
    free(buff_00->body);
    free(buff_00);
    _num = reverse(s);
  }
  return _num;
}

Assistant:

char *itochr(int i) {
    int num = abs(i);
    if (num == 0) return "0";
    CharBuff *buff = new_buff(10);
    int n;
    while (num > 0) {
        n = num % 10;
        append_chr(buff, (char) (n + '0'));
        num /= 10;
    }
    if (i < 0) {
        append_chr(buff, '-');
    }
    char *value = to_string(buff);
    free(buff->body);
    free(buff);
    return reverse(value);
}